

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O0

int sha256_update(sha256_context *ctx,uchar *input,size_t ilen)

{
  int iVar1;
  ulong __n;
  uint local_3c;
  uint32_t left;
  size_t fill;
  size_t sStack_28;
  int ret;
  size_t ilen_local;
  uchar *input_local;
  sha256_context *ctx_local;
  
  if (ilen != 0) {
    local_3c = ctx->total[0] & 0x3f;
    __n = (ulong)(0x40 - local_3c);
    ctx->total[0] = (uint)ilen + ctx->total[0];
    ctx->total[0] = ctx->total[0];
    if (ctx->total[0] < (uint)ilen) {
      ctx->total[1] = ctx->total[1] + 1;
    }
    sStack_28 = ilen;
    ilen_local = (size_t)input;
    if ((local_3c != 0) && (__n <= ilen)) {
      memcpy(ctx->buffer + local_3c,input,__n);
      iVar1 = internal_sha256_process(ctx,ctx->buffer);
      if (iVar1 != 0) {
        return iVar1;
      }
      ilen_local = (size_t)(input + __n);
      sStack_28 = ilen - __n;
      local_3c = 0;
    }
    for (; 0x3f < sStack_28; sStack_28 = sStack_28 - 0x40) {
      iVar1 = internal_sha256_process(ctx,(uchar *)ilen_local);
      if (iVar1 != 0) {
        return iVar1;
      }
      ilen_local = ilen_local + 0x40;
    }
    if (sStack_28 != 0) {
      memcpy(ctx->buffer + local_3c,(void *)ilen_local,sStack_28);
    }
  }
  return 0;
}

Assistant:

int sha256_update(sha256_context *ctx,
  const unsigned char *input,
  size_t ilen) {
  int ret;
  size_t fill;
  uint32_t left;

  if (ilen == 0)
    return(0);

  left = ctx->total[0] & 0x3F;
  fill = 64 - left;

  ctx->total[0] += (uint32_t)ilen;
  ctx->total[0] &= 0xFFFFFFFF;

  if (ctx->total[0] < (uint32_t)ilen)
    ctx->total[1]++;

  if (left && ilen >= fill) {
    memcpy((void *)(ctx->buffer + left), input, fill);

    if ((ret = internal_sha256_process(ctx, ctx->buffer)) != 0)
      return(ret);

    input += fill;
    ilen -= fill;
    left = 0;
  }

  while (ilen >= 64) {
    if ((ret = internal_sha256_process(ctx, input)) != 0)
      return(ret);

    input += 64;
    ilen -= 64;
  }

  if (ilen > 0)
    memcpy((void *)(ctx->buffer + left), input, ilen);

  return(0);
}